

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn_common.h
# Opt level: O0

MemoryRegion * find_memory_mapping_arm(uc_struct_conflict *uc,hwaddr address)

{
  uint local_3c;
  MemoryRegion *mr;
  hwaddr len;
  hwaddr xlat;
  hwaddr address_local;
  uc_struct_conflict *uc_local;
  
  len = 0;
  mr = (MemoryRegion *)&DAT_00000001;
  xlat = address;
  address_local = (hwaddr)uc;
  uc_local = (uc_struct_conflict *)
             address_space_translate
                       (&uc->address_space_memory,address,&len,(hwaddr *)&mr,false,
                        (MemTxAttrs)(local_3c & 0xff800000 | 1));
  if (uc_local == (uc_struct_conflict *)(address_local + 0x1d0)) {
    uc_local = (uc_struct_conflict *)0x0;
  }
  return (MemoryRegion *)uc_local;
}

Assistant:

MemoryRegion *find_memory_mapping(struct uc_struct *uc, hwaddr address)
{
    hwaddr xlat = 0;
    hwaddr len = 1;
    MemoryRegion *mr = address_space_translate(&uc->address_space_memory, address, &xlat, &len, false, MEMTXATTRS_UNSPECIFIED);

    if (mr == &uc->io_mem_unassigned) {
        return NULL;
    }
    return mr;
}